

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O1

void __thiscall UKF::Prediction(UKF *this,double delta_t)

{
  VectorXd *this_00;
  double *pdVar1;
  double *pdVar2;
  double **ppdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  DenseIndex DVar9;
  Index size_5;
  undefined8 *puVar10;
  Index index_6;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pLVar11;
  ulong uVar12;
  char *pcVar13;
  Index index_1;
  long lVar14;
  long lVar15;
  undefined8 in_RSI;
  Index index;
  ulong uVar16;
  long lVar17;
  Index index_3;
  ulong uVar18;
  double *pdVar19;
  Index index_5;
  long lVar20;
  Index row;
  long lVar21;
  Index row_1;
  Index othersize;
  int iVar22;
  bool bVar23;
  double dVar24;
  VectorXd x_aug;
  MatrixXd Xsig_aug;
  VectorXd x_diff;
  MatrixXd P_aug;
  MatrixXd Xsig;
  MatrixXd L;
  MatrixXd A;
  long local_1b8;
  DenseStorage<double,__1,__1,_1,_0> local_1a8;
  double local_198;
  double local_190;
  DenseStorage<double,__1,__1,__1,_0> local_188;
  DenseStorage<double,__1,__1,_1,_0> local_168;
  DenseStorage<double,__1,__1,__1,_0> local_158;
  DenseStorage<double,__1,__1,__1,_0> local_138;
  double local_118;
  double local_110;
  undefined1 local_108 [24];
  void *local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *local_d8;
  double local_d0;
  void *local_c8;
  ulong local_c0;
  long local_b8;
  void *local_b0;
  ulong local_a8;
  long local_a0;
  double local_98;
  double local_90;
  double local_88;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *local_80;
  PlainObject *local_78;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  uVar18 = (ulong)this->n_x_;
  uVar16 = uVar18 * 2 + 1;
  local_138.m_data = (double *)0x0;
  local_138.m_rows = 0;
  local_138.m_cols = 0;
  if ((long)(uVar16 | uVar18) < 0) goto LAB_001056c1;
  local_d0 = delta_t;
  if ((this->n_x_ != 0) &&
     (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar5 / SEXT816((long)uVar16),0) < (long)uVar18)) {
    puVar10 = (undefined8 *)
              __cxa_allocate_exception(8,in_RSI,SUB168(auVar5 % SEXT816((long)uVar16),0));
    *puVar10 = operator_delete;
    __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,uVar16 * uVar18,uVar18,uVar16);
  local_d8 = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&this->P_;
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_108,(MatrixType *)local_d8);
  if (local_f0._0_1_ == false) {
LAB_001056e0:
    __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Cholesky/LLT.h"
                  ,0x6a,
                  "typename Traits::MatrixL Eigen::LLT<Eigen::Matrix<double, -1, -1>>::matrixL() const [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                 );
  }
  local_158.m_data = (double *)local_108;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_b0,
             (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
              *)&local_158);
  free((void *)local_108._0_8_);
  this->lambda_ = (double)(3 - this->n_x_);
  if (local_138.m_rows < 0 && local_138.m_data != (double *)0x0) {
LAB_001055b8:
    __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/MapBase.h"
                  ,0x94,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                 );
  }
  if (local_138.m_cols < 1) {
LAB_001055d7:
    __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Block.h"
                  ,0x76,
                  "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                 );
  }
  if (local_138.m_rows ==
      (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    uVar16 = (ulong)((uint)((ulong)local_138.m_data >> 3) & 1);
    if (local_138.m_rows <= (long)uVar16) {
      uVar16 = local_138.m_rows;
    }
    if (((ulong)local_138.m_data & 7) != 0) {
      uVar16 = local_138.m_rows;
    }
    this_00 = &this->x_;
    lVar17 = local_138.m_rows - uVar16;
    if (0 < (long)uVar16) {
      pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar18 = 0;
      do {
        local_138.m_data[uVar18] = pdVar19[uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar16 != uVar18);
    }
    uVar18 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
    if (1 < lVar17) {
      do {
        pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data + uVar16;
        dVar7 = pdVar19[1];
        local_138.m_data[uVar16] = *pdVar19;
        (local_138.m_data + uVar16)[1] = dVar7;
        uVar16 = uVar16 + 2;
      } while ((long)uVar16 < (long)uVar18);
    }
    if ((long)uVar18 < local_138.m_rows) {
      pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      do {
        local_138.m_data[uVar18] = pdVar19[uVar18];
        uVar18 = uVar18 + 1;
      } while (local_138.m_rows != uVar18);
    }
    uVar16 = (ulong)(uint)this->n_x_;
    if (0 < this->n_x_) {
      local_1b8 = 8;
      iVar22 = 1;
      lVar15 = 0;
      lVar17 = 0;
      do {
        dVar7 = (double)(int)uVar16 + this->lambda_;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        if (((long)local_a8 < 0) &&
           ((void *)((long)local_b0 + local_a8 * lVar17 * 8) != (void *)0x0)) goto LAB_001055b8;
        if (local_a0 <= lVar17) goto LAB_001055d7;
        if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != local_a8) goto LAB_001055f6;
        lVar14 = lVar17 + 1;
        pdVar19 = local_138.m_data + local_138.m_rows * lVar14;
        if (local_138.m_rows < 0 && pdVar19 != (double *)0x0) goto LAB_001055b8;
        if (local_138.m_cols <= lVar14) goto LAB_001055d7;
        if (local_138.m_rows != local_a8) goto LAB_0010563e;
        uVar16 = (ulong)((uint)((ulong)pdVar19 >> 3) & 1);
        if (local_138.m_rows <= (long)uVar16) {
          uVar16 = local_138.m_rows;
        }
        if (((ulong)pdVar19 & 7) != 0) {
          uVar16 = local_138.m_rows;
        }
        if (0 < (long)uVar16) {
          pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          uVar18 = 0;
          do {
            *(double *)((long)local_138.m_data + uVar18 * 8 + local_138.m_rows * local_1b8) =
                 *(double *)((long)local_b0 + uVar18 * 8 + local_a8 * lVar15) * dVar7 +
                 pdVar19[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        lVar20 = local_138.m_rows - uVar16;
        uVar18 = (lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
        if (1 < lVar20) {
          do {
            pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data + uVar16;
            dVar8 = pdVar19[1];
            pdVar1 = (double *)((long)local_b0 + uVar16 * 8 + local_a8 * lVar15);
            dVar24 = pdVar1[1];
            pdVar2 = (double *)((long)local_138.m_data + uVar16 * 8 + local_138.m_rows * local_1b8);
            *pdVar2 = *pdVar1 * dVar7 + *pdVar19;
            pdVar2[1] = dVar24 * dVar7 + dVar8;
            uVar16 = uVar16 + 2;
          } while ((long)uVar16 < (long)uVar18);
        }
        if ((long)uVar18 < local_138.m_rows) {
          pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          do {
            *(double *)((long)local_138.m_data + uVar18 * 8 + local_138.m_rows * local_1b8) =
                 *(double *)((long)local_b0 + uVar18 * 8 + local_a8 * lVar15) * dVar7 +
                 pdVar19[uVar18];
            uVar18 = uVar18 + 1;
          } while (local_138.m_rows != uVar18);
        }
        dVar7 = (double)this->n_x_ + this->lambda_;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        if (((long)local_a8 < 0) &&
           ((void *)((long)local_b0 + local_a8 * lVar17 * 8) != (void *)0x0)) goto LAB_001055b8;
        if (local_a0 <= lVar17) goto LAB_001055d7;
        if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != local_a8) goto LAB_00105627;
        lVar17 = (long)this->n_x_;
        lVar20 = (int)lVar14 + lVar17;
        pdVar19 = local_138.m_data + local_138.m_rows * lVar20;
        if ((local_138.m_rows < 0) && (pdVar19 != (double *)0x0)) goto LAB_001055b8;
        if (((int)lVar20 < 0) || (local_138.m_cols <= lVar20)) goto LAB_001055d7;
        if (local_138.m_rows != local_a8) goto LAB_00105610;
        lVar20 = (long)iVar22;
        uVar16 = (ulong)((uint)((ulong)pdVar19 >> 3) & 1);
        if (local_138.m_rows <= (long)uVar16) {
          uVar16 = local_138.m_rows;
        }
        if (((ulong)pdVar19 & 7) != 0) {
          uVar16 = local_138.m_rows;
        }
        if (0 < (long)uVar16) {
          pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          uVar18 = 0;
          do {
            local_138.m_data[(lVar17 + lVar20) * local_138.m_rows + uVar18] =
                 pdVar19[uVar18] -
                 *(double *)((long)local_b0 + uVar18 * 8 + local_a8 * lVar15) * dVar7;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        lVar21 = local_138.m_rows - uVar16;
        uVar18 = (lVar21 - (lVar21 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
        if (1 < lVar21) {
          do {
            pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data + uVar16;
            dVar8 = pdVar19[1];
            pdVar1 = (double *)((long)local_b0 + uVar16 * 8 + local_a8 * lVar15);
            dVar24 = pdVar1[1];
            local_138.m_data[(lVar17 + lVar20) * local_138.m_rows + uVar16] =
                 *pdVar19 - *pdVar1 * dVar7;
            (local_138.m_data + (lVar17 + lVar20) * local_138.m_rows + uVar16)[1] =
                 dVar8 - dVar24 * dVar7;
            uVar16 = uVar16 + 2;
          } while ((long)uVar16 < (long)uVar18);
        }
        if ((long)uVar18 < local_138.m_rows) {
          pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          do {
            local_138.m_data[(lVar17 + lVar20) * local_138.m_rows + uVar18] =
                 pdVar19[uVar18] -
                 *(double *)((long)local_b0 + uVar18 * 8 + local_a8 * lVar15) * dVar7;
            uVar18 = uVar18 + 1;
          } while (local_138.m_rows != uVar18);
        }
        uVar16 = (ulong)this->n_x_;
        local_1b8 = local_1b8 + 8;
        lVar15 = lVar15 + 8;
        iVar22 = iVar22 + 1;
        lVar17 = lVar14;
      } while (lVar14 < (long)uVar16);
    }
    iVar22 = this->n_aug_;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1a8,(long)iVar22,(long)iVar22,1);
    if (iVar22 < 0) {
      __assert_fail("dim >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Matrix.h"
                    ,0xf0,
                    "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                   );
    }
    local_158.m_data = (double *)0x0;
    local_158.m_rows = 0;
    local_158.m_cols = 0;
    uVar16 = (ulong)this->n_aug_;
    if ((long)uVar16 < 0) {
LAB_001056c1:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((this->n_aug_ != 0) &&
       (auVar5._8_8_ = 0, auVar5._0_8_ = uVar16,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar5,0) < (long)uVar16)) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = operator_delete;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_158,uVar16 * uVar16,uVar16,uVar16);
    uVar18 = (ulong)this->n_aug_;
    uVar16 = uVar18 * 2 + 1;
    local_188.m_data = (double *)0x0;
    local_188.m_rows = 0;
    local_188.m_cols = 0;
    if ((long)(uVar16 | uVar18) < 0) goto LAB_001056c1;
    if ((this->n_aug_ != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar16),0) <
        (long)uVar18)) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = operator_delete;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_188,uVar16 * uVar18,uVar18,uVar16);
    this->lambda_ = (double)(3 - this->n_aug_);
    if (local_1a8.m_rows < 5) {
      pcVar13 = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
LAB_001057af:
      __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Block.h"
                    ,0x8d,pcVar13);
    }
    if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != 5) {
      pcVar13 = 
      "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00105698;
    }
    uVar16 = 5;
    if (((ulong)local_1a8.m_data & 7) == 0) {
      uVar16 = (ulong)((uint)((ulong)local_1a8.m_data >> 3) & 1);
    }
    if (uVar16 != 0) {
      pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar18 = 0;
      do {
        local_1a8.m_data[uVar18] = pdVar19[uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar16 != uVar18);
    }
    uVar18 = uVar16 | 4;
    if (((ulong)local_1a8.m_data & 7) == 0) {
      do {
        pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data + uVar16;
        dVar7 = pdVar19[1];
        local_1a8.m_data[uVar16] = *pdVar19;
        (local_1a8.m_data + uVar16)[1] = dVar7;
        uVar16 = uVar16 + 2;
      } while (uVar16 < uVar18);
    }
    if ((uint)uVar18 < 5) {
      pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      do {
        local_1a8.m_data[uVar18] = pdVar19[uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar18 != 5);
    }
    if ((local_1a8.m_rows < 6) || (local_1a8.m_data[5] = 0.0, local_1a8.m_rows == 6)) {
LAB_0010557a:
      __assert_fail("index >= 0 && index < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x18a,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    local_1a8.m_data[6] = 0.0;
    local_108._0_8_ = local_158.m_rows;
    local_108._8_8_ = local_158.m_cols;
    local_108._16_8_ = (DenseStorage<double,__1,__1,_1,_0> *)0x0;
    if (-1 < (local_158.m_cols | local_158.m_rows)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_158,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_108);
      if ((local_158.m_rows < 5) || (local_158.m_cols < 5)) {
        pcVar13 = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
        ;
        goto LAB_001057af;
      }
      if (((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows != 5) ||
         ((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols != 5)) {
        pcVar13 = 
        "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
        ;
        goto LAB_00105698;
      }
      uVar16 = 5;
      if (((ulong)local_158.m_data & 7) == 0) {
        uVar16 = (ulong)((uint)((ulong)local_158.m_data >> 3) & 1);
      }
      lVar17 = 0;
      lVar15 = 0;
      pLVar11 = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_158.m_data;
      do {
        if (uVar16 != 0) {
          lVar14 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          pdVar19 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
          uVar18 = 0;
          do {
            (&(pLVar11->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data)[uVar18] = *(double **)((long)pdVar19 + uVar18 * 8 + lVar14 * lVar17)
            ;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar12 = (ulong)(5U - (int)uVar16 & 6);
        uVar18 = uVar16;
        if (uVar12 != 0) {
          do {
            puVar10 = (undefined8 *)
                      ((long)(this->P_).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data +
                      uVar18 * 8 +
                      (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows * lVar17);
            DVar9 = puVar10[1];
            ppdVar3 = &(pLVar11->m_matrix).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data + uVar18;
            *ppdVar3 = (double *)*puVar10;
            ppdVar3[1] = (double *)DVar9;
            uVar18 = uVar18 + 2;
          } while ((long)uVar18 < (long)(uVar12 + uVar16));
        }
        if (uVar12 + uVar16 < 5) {
          lVar20 = uVar12 + uVar16 + -1;
          lVar14 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          pdVar19 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
          do {
            (&(pLVar11->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows)[lVar20] =
                 *(DenseIndex *)((long)pdVar19 + lVar20 * 8 + lVar14 * lVar17 + 8);
            lVar20 = lVar20 + 1;
          } while (lVar20 < 4);
        }
        uVar16 = (ulong)((int)uVar16 + (int)local_158.m_rows & 1);
        lVar15 = lVar15 + 1;
        pLVar11 = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                  (&(pLVar11->m_matrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data + local_158.m_rows);
        lVar17 = lVar17 + 8;
      } while (lVar15 != 5);
      if ((((local_158.m_rows < 6) || (local_158.m_cols < 6)) ||
          (*(double *)((long)local_158.m_data + local_158.m_rows * 0x28 + 0x28) =
                this->std_a_ * this->std_a_,
          (DenseStorage<double,__1,__1,_1,_0> *)local_158.m_rows ==
          (DenseStorage<double,__1,__1,_1,_0> *)0x6)) ||
         ((double)local_158.m_cols == 2.96439387504748e-323)) {
LAB_00105599:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      *(double *)((long)local_158.m_data + local_158.m_rows * 0x30 + 0x30) =
           this->std_yawdd_ * this->std_yawdd_;
      Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
                ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_108,
                 (MatrixType *)&local_158);
      if (local_f0._0_1_ == false) goto LAB_001056e0;
      local_80 = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_108;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_c8,
                 (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                  *)&local_80);
      free((void *)local_108._0_8_);
      if (local_188.m_rows < 0 && local_188.m_data != (double *)0x0) goto LAB_001055b8;
      if (local_188.m_cols < 1) goto LAB_001055d7;
      if (local_188.m_rows != local_1a8.m_rows) goto LAB_001056ff;
      uVar16 = (ulong)((uint)((ulong)local_188.m_data >> 3) & 1);
      if (local_188.m_rows <= (long)uVar16) {
        uVar16 = local_188.m_rows;
      }
      if (((ulong)local_188.m_data & 7) != 0) {
        uVar16 = local_188.m_rows;
      }
      lVar17 = local_188.m_rows - uVar16;
      if (0 < (long)uVar16) {
        uVar18 = 0;
        do {
          local_188.m_data[uVar18] = local_1a8.m_data[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
      }
      uVar18 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
      if (1 < lVar17) {
        do {
          dVar7 = (local_1a8.m_data + uVar16)[1];
          local_188.m_data[uVar16] = local_1a8.m_data[uVar16];
          (local_188.m_data + uVar16)[1] = dVar7;
          uVar16 = uVar16 + 2;
        } while ((long)uVar16 < (long)uVar18);
      }
      if ((long)uVar18 < local_188.m_rows) {
        do {
          local_188.m_data[uVar18] = local_1a8.m_data[uVar18];
          uVar18 = uVar18 + 1;
        } while (local_188.m_rows != uVar18);
      }
      uVar16 = (ulong)(uint)this->n_aug_;
      if (0 < this->n_aug_) {
        local_1b8 = 8;
        iVar22 = 1;
        lVar15 = 0;
        lVar17 = 0;
        do {
          dVar7 = (double)(int)uVar16 + this->lambda_;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          if (((long)local_c0 < 0) &&
             ((void *)((long)local_c8 + local_c0 * lVar17 * 8) != (void *)0x0)) goto LAB_001055b8;
          if (local_b8 <= lVar17) goto LAB_001055d7;
          if (local_1a8.m_rows != local_c0) goto LAB_001055f6;
          lVar14 = lVar17 + 1;
          pdVar19 = local_188.m_data + local_188.m_rows * lVar14;
          if (local_188.m_rows < 0 && pdVar19 != (double *)0x0) goto LAB_001055b8;
          if (local_188.m_cols <= lVar14) goto LAB_001055d7;
          if (local_188.m_rows != local_c0) goto LAB_0010563e;
          uVar16 = (ulong)((uint)((ulong)pdVar19 >> 3) & 1);
          if (local_188.m_rows <= (long)uVar16) {
            uVar16 = local_188.m_rows;
          }
          if (((ulong)pdVar19 & 7) != 0) {
            uVar16 = local_188.m_rows;
          }
          if (0 < (long)uVar16) {
            uVar18 = 0;
            do {
              *(double *)((long)local_188.m_data + uVar18 * 8 + local_188.m_rows * local_1b8) =
                   *(double *)((long)local_c8 + uVar18 * 8 + local_c0 * lVar15) * dVar7 +
                   local_1a8.m_data[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          lVar20 = local_188.m_rows - uVar16;
          uVar18 = (lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
          if (1 < lVar20) {
            do {
              dVar8 = (local_1a8.m_data + uVar16)[1];
              pdVar19 = (double *)((long)local_c8 + uVar16 * 8 + local_c0 * lVar15);
              dVar24 = pdVar19[1];
              pdVar1 = (double *)
                       ((long)local_188.m_data + uVar16 * 8 + local_188.m_rows * local_1b8);
              *pdVar1 = *pdVar19 * dVar7 + local_1a8.m_data[uVar16];
              pdVar1[1] = dVar24 * dVar7 + dVar8;
              uVar16 = uVar16 + 2;
            } while ((long)uVar16 < (long)uVar18);
          }
          if ((long)uVar18 < local_188.m_rows) {
            do {
              *(double *)((long)local_188.m_data + uVar18 * 8 + local_188.m_rows * local_1b8) =
                   *(double *)((long)local_c8 + uVar18 * 8 + local_c0 * lVar15) * dVar7 +
                   local_1a8.m_data[uVar18];
              uVar18 = uVar18 + 1;
            } while (local_188.m_rows != uVar18);
          }
          dVar7 = (double)this->n_aug_ + this->lambda_;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          if (((long)local_c0 < 0) &&
             ((void *)((long)local_c8 + local_c0 * lVar17 * 8) != (void *)0x0)) goto LAB_001055b8;
          if (local_b8 <= lVar17) goto LAB_001055d7;
          if (local_1a8.m_rows != local_c0) goto LAB_00105627;
          lVar17 = (long)this->n_aug_;
          lVar20 = (int)lVar14 + lVar17;
          pdVar19 = local_188.m_data + local_188.m_rows * lVar20;
          if ((local_188.m_rows < 0) && (pdVar19 != (double *)0x0)) goto LAB_001055b8;
          if (((int)lVar20 < 0) || (local_188.m_cols <= lVar20)) goto LAB_001055d7;
          if (local_188.m_rows != local_c0) goto LAB_00105610;
          lVar20 = (long)iVar22;
          uVar16 = (ulong)((uint)((ulong)pdVar19 >> 3) & 1);
          if (local_188.m_rows <= (long)uVar16) {
            uVar16 = local_188.m_rows;
          }
          if (((ulong)pdVar19 & 7) != 0) {
            uVar16 = local_188.m_rows;
          }
          if (0 < (long)uVar16) {
            uVar18 = 0;
            do {
              local_188.m_data[(lVar17 + lVar20) * local_188.m_rows + uVar18] =
                   local_1a8.m_data[uVar18] -
                   *(double *)((long)local_c8 + uVar18 * 8 + local_c0 * lVar15) * dVar7;
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          lVar21 = local_188.m_rows - uVar16;
          uVar18 = (lVar21 - (lVar21 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
          if (1 < lVar21) {
            do {
              dVar8 = (local_1a8.m_data + uVar16)[1];
              pdVar19 = (double *)((long)local_c8 + uVar16 * 8 + local_c0 * lVar15);
              dVar24 = pdVar19[1];
              local_188.m_data[(lVar17 + lVar20) * local_188.m_rows + uVar16] =
                   local_1a8.m_data[uVar16] - *pdVar19 * dVar7;
              (local_188.m_data + (lVar17 + lVar20) * local_188.m_rows + uVar16)[1] =
                   dVar8 - dVar24 * dVar7;
              uVar16 = uVar16 + 2;
            } while ((long)uVar16 < (long)uVar18);
          }
          if ((long)uVar18 < local_188.m_rows) {
            do {
              local_188.m_data[(lVar17 + lVar20) * local_188.m_rows + uVar18] =
                   local_1a8.m_data[uVar18] -
                   *(double *)((long)local_c8 + uVar18 * 8 + local_c0 * lVar15) * dVar7;
              uVar18 = uVar18 + 1;
            } while (local_188.m_rows != uVar18);
          }
          uVar16 = (ulong)this->n_aug_;
          local_1b8 = local_1b8 + 8;
          lVar15 = lVar15 + 8;
          iVar22 = iVar22 + 1;
          lVar17 = lVar14;
        } while (lVar14 < (long)uVar16);
      }
      iVar22 = this->n_aug_;
      if (iVar22 < 0) {
        uVar16 = (ulong)(uint)(iVar22 * 2);
      }
      else {
        lVar17 = -1;
        do {
          if ((((local_188.m_rows < 1) || (lVar17 = lVar17 + 1, local_188.m_cols <= lVar17)) ||
              (local_188.m_rows < 2)) ||
             (((local_188.m_rows == 2 || (local_188.m_rows < 4)) ||
              ((local_188.m_rows == 4 || ((local_188.m_rows < 6 || (local_188.m_rows == 6))))))))
          goto LAB_00105599;
          lVar15 = local_188.m_rows * lVar17;
          local_198 = local_188.m_data[lVar15];
          local_118 = local_188.m_data[lVar15 + 1];
          local_98 = local_188.m_data[lVar15 + 2];
          dVar7 = local_188.m_data[lVar15 + 3];
          local_58 = local_188.m_data[lVar15 + 4];
          local_88 = local_188.m_data[lVar15 + 5];
          local_90 = local_188.m_data[lVar15 + 6];
          local_48 = local_58 * local_d0;
          uStack_50 = 0;
          uStack_40 = 0;
          if (ABS(local_58) <= 0.001) {
            local_190 = local_98 * local_d0;
            dVar8 = cos(dVar7);
            local_110 = dVar8 * local_190 + local_198;
            dVar8 = sin(dVar7);
            local_198 = dVar8 * local_190 + local_118;
          }
          else {
            local_190 = local_98 / local_58;
            local_68 = local_48 + dVar7;
            uStack_60 = 0;
            local_110 = sin(local_68);
            dVar8 = sin(dVar7);
            local_110 = (local_110 - dVar8) * local_190 + local_198;
            local_198 = cos(dVar7);
            dVar8 = cos(local_68);
            local_198 = (local_198 - dVar8) * local_190 + local_118;
          }
          local_118 = cos(dVar7);
          dVar8 = sin(dVar7);
          lVar15 = (this->Xsig_pred_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          if ((lVar15 < 1) ||
             ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar17)) goto LAB_00105599;
          dVar24 = local_88 * 0.5 * local_d0 * local_d0;
          pdVar19 = (this->Xsig_pred_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data;
          lVar14 = lVar15 * lVar17;
          pdVar19[lVar14] = local_118 * dVar24 + local_110;
          if ((lVar15 < 2) ||
             (((pdVar19[lVar14 + 1] = dVar24 * dVar8 + local_198, lVar15 == 2 ||
               (pdVar19[lVar14 + 2] = local_88 * local_d0 + local_98, lVar15 < 4)) ||
              (pdVar19[lVar14 + 3] = local_90 * 0.5 * local_d0 * local_d0 + local_48 + dVar7,
              lVar15 == 4)))) goto LAB_00105599;
          pdVar19[lVar14 + 4] = local_90 * local_d0 + local_58;
          iVar22 = this->n_aug_;
          uVar16 = (long)iVar22 * 2;
        } while (SBORROW8(lVar17,uVar16) != lVar17 + (long)iVar22 * -2 < 0);
      }
      lVar17 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if (lVar17 < 1) goto LAB_0010557a;
      pdVar19 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      *pdVar19 = this->lambda_ / (this->lambda_ + (double)iVar22);
      if (0 < (int)uVar16) {
        uVar18 = 0;
        do {
          if (lVar17 - 1U == uVar18) goto LAB_0010557a;
          pdVar19[uVar18 + 1] = 0.5 / (this->lambda_ + (double)iVar22);
          uVar18 = uVar18 + 1;
        } while ((uVar16 & 0xffffffff) != uVar18);
      }
      lVar17 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (lVar17 < 0) {
        pcVar13 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_001057ce;
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar17,1);
      lVar15 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (lVar15 != lVar17) {
        pcVar13 = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_00105698;
      }
      uVar16 = lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < lVar15) {
        lVar17 = 0;
        do {
          pdVar19 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data + lVar17;
          *pdVar19 = 0.0;
          pdVar19[1] = 0.0;
          lVar17 = lVar17 + 2;
        } while (lVar17 < (long)uVar16);
      }
      if ((long)uVar16 < lVar15) {
        memset((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data + (lVar15 / 2) * 2,0,lVar15 * 8 + (lVar15 / 2) * -0x10);
      }
      if (-1 < this->n_aug_) {
        lVar15 = 0;
        lVar17 = 0;
        do {
          if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar17) goto LAB_0010557a;
          pdVar19 = (this->Xsig_pred_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data;
          uVar16 = (this->Xsig_pred_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          if (((long)uVar16 < 0) && (pdVar19 + uVar16 * lVar17 != (double *)0x0)) goto LAB_001055b8;
          if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar17) goto LAB_001055d7;
          if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != uVar16) goto LAB_001055f6;
          dVar7 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[lVar17];
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar16
                     ,1);
          uVar18 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (uVar18 != uVar16) {
            pcVar13 = 
            "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
            ;
            goto LAB_00105698;
          }
          uVar12 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar18) {
            lVar14 = 0;
            do {
              pdVar4 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              pdVar1 = pdVar4 + lVar14;
              dVar8 = pdVar1[1];
              pdVar2 = (double *)((long)pdVar19 + lVar14 * 8 + uVar16 * lVar15);
              dVar24 = pdVar2[1];
              pdVar4 = pdVar4 + lVar14;
              *pdVar4 = *pdVar2 * dVar7 + *pdVar1;
              pdVar4[1] = dVar24 * dVar7 + dVar8;
              lVar14 = lVar14 + 2;
            } while (lVar14 < (long)uVar12);
          }
          if ((long)uVar12 < (long)uVar18) {
            pdVar1 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            do {
              pdVar1[uVar12] =
                   *(double *)((long)pdVar19 + uVar12 * 8 + uVar16 * lVar15) * dVar7 +
                   pdVar1[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar18 != uVar12);
          }
          lVar15 = lVar15 + 8;
          bVar23 = SBORROW8(lVar17,(long)this->n_aug_ * 2);
          lVar14 = lVar17 + (long)this->n_aug_ * -2;
          lVar17 = lVar17 + 1;
        } while (bVar23 != lVar14 < 0);
      }
      local_108._0_8_ =
           (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_108._8_8_ =
           (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_108._16_8_ = (DenseStorage<double,__1,__1,_1,_0> *)0x0;
      if (-1 < (long)(local_108._8_8_ | local_108._0_8_)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d8,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_108);
        if (-1 < this->n_aug_) {
          lVar15 = 0;
          lVar17 = 0;
          do {
            pdVar19 = (this->Xsig_pred_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            lVar14 = (this->Xsig_pred_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            if ((lVar14 < 0) && (pdVar19 + lVar14 * lVar17 != (double *)0x0)) goto LAB_001055b8;
            if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols <= lVar17) goto LAB_001055d7;
            lVar20 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if (lVar14 != lVar20) {
              pcVar13 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_001056b7;
            }
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_168,lVar20,lVar20,1);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_168,
                       (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows,1);
            if (local_168.m_rows !=
                (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
              pcVar13 = 
              "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_00105698;
            }
            uVar16 = local_168.m_rows - (local_168.m_rows >> 0x3f) & 0xfffffffffffffffe;
            if (1 < local_168.m_rows) {
              lVar20 = 0;
              do {
                pdVar1 = (double *)((long)pdVar19 + lVar20 * 8 + lVar14 * lVar15);
                pdVar2 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + lVar20;
                dVar7 = pdVar1[1] - pdVar2[1];
                auVar6._8_4_ = SUB84(dVar7,0);
                auVar6._0_8_ = *pdVar1 - *pdVar2;
                auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
                *(undefined1 (*) [16])(local_168.m_data + lVar20) = auVar6;
                lVar20 = lVar20 + 2;
              } while (lVar20 < (long)uVar16);
            }
            if ((long)uVar16 < local_168.m_rows) {
              pdVar1 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              do {
                local_168.m_data[uVar16] =
                     *(double *)((long)pdVar19 + uVar16 * 8 + lVar14 * lVar15) - pdVar1[uVar16];
                uVar16 = uVar16 + 1;
              } while (local_168.m_rows != uVar16);
            }
            if (local_168.m_rows < 4) goto LAB_0010557a;
            dVar7 = local_168.m_data[3];
            while (3.141592653589793 < dVar7) {
              dVar7 = dVar7 + -6.283185307179586;
              local_168.m_data[3] = dVar7;
              if (local_168.m_rows < 4) goto LAB_0010557a;
            }
            dVar7 = local_168.m_data[3];
            if (dVar7 < -3.141592653589793) {
              do {
                dVar7 = dVar7 + 6.283185307179586;
              } while (dVar7 < -3.141592653589793);
              local_168.m_data[3] = dVar7;
            }
            if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= lVar17) goto LAB_0010557a;
            local_108._8_8_ =
                 (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar17];
            local_f0 = (void *)0x0;
            uStack_e8 = 0;
            local_e0 = 0;
            local_80 = local_d8;
            local_108._0_8_ = &local_168;
            local_108._16_8_ = &local_168;
            local_78 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_108);
            if (((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows != *(DenseIndex *)(local_108._0_8_ + 8)) ||
               ((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols != *(DenseIndex *)(local_108._16_8_ + 8))) {
              pcVar13 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
              ;
              goto LAB_001056b7;
            }
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d8,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                        *)&local_80);
            free(local_f0);
            free(local_168.m_data);
            lVar15 = lVar15 + 8;
            bVar23 = SBORROW8(lVar17,(long)this->n_aug_ * 2);
            lVar14 = lVar17 + (long)this->n_aug_ * -2;
            lVar17 = lVar17 + 1;
          } while (bVar23 != lVar14 < 0);
        }
        free(local_c8);
        free(local_188.m_data);
        free(local_158.m_data);
        free(local_1a8.m_data);
        free(local_b0);
        free(local_138.m_data);
        return;
      }
    }
    local_108._16_8_ = (DenseStorage<double,__1,__1,_1,_0> *)0x0;
    pcVar13 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_001057ce:
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,pcVar13);
  }
LAB_001056ff:
  pcVar13 = 
  "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_00105698;
LAB_0010563e:
  pcVar13 = 
  "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
  ;
  goto LAB_00105698;
LAB_00105627:
  pcVar13 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
  ;
  goto LAB_001056b7;
LAB_001055f6:
  pcVar13 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
  ;
LAB_001056b7:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x84,pcVar13);
LAB_00105610:
  pcVar13 = 
  "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
  ;
LAB_00105698:
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Assign.h"
                ,0x1f9,pcVar13);
}

Assistant:

void UKF::Prediction(double delta_t) {
  /**
  TODO:

  Complete this function! Estimate the object's location. Modify the state
  vector, x_. Predict sigma points, the state, and the state covariance matrix.
  */

  /*****************************************************************************
  *  Generate Sigma Points
  ****************************************************************************/
  //create sigma point matrix
  MatrixXd Xsig = MatrixXd(n_x_, 2 * n_x_ + 1);

  //calculate square root of P
  MatrixXd A = P_.llt().matrixL();

  //set lambda for non-augmented sigma points
  lambda_ = 3 - n_x_;

  //set first column of sigma point matrix
  Xsig.col(0) = x_;

  //set remaining sigma points
  for (int i = 0; i < n_x_; i++)
  {
    Xsig.col(i + 1) = x_ + sqrt(lambda_ + n_x_) * A.col(i);
    Xsig.col(i + 1 + n_x_) = x_ - sqrt(lambda_ + n_x_) * A.col(i);
  }

  /*****************************************************************************
  *  Augment Sigma Points
  ****************************************************************************/
  //create augmented mean vector
  VectorXd x_aug = VectorXd(n_aug_);

  //create augmented state covariance
  MatrixXd P_aug = MatrixXd(n_aug_, n_aug_);

  //create sigma point matrix
  MatrixXd Xsig_aug = MatrixXd(n_aug_, 2 * n_aug_ + 1);

  //set lambda for augmented sigma points
  lambda_ = 3 - n_aug_;

  //create augmented mean state
  x_aug.head(5) = x_;
  x_aug(5) = 0;
  x_aug(6) = 0;

  //create augmented covariance matrix
  P_aug.fill(0.0);
  P_aug.topLeftCorner(5, 5) = P_;
  P_aug(5, 5) = std_a_*std_a_;
  P_aug(6, 6) = std_yawdd_*std_yawdd_;

  //create square root matrix
  MatrixXd L = P_aug.llt().matrixL();

  //create augmented sigma points
  Xsig_aug.col(0) = x_aug;
  for (int i = 0; i< n_aug_; i++)
  {
    Xsig_aug.col(i + 1) = x_aug + sqrt(lambda_ + n_aug_) * L.col(i);
    Xsig_aug.col(i + 1 + n_aug_) = x_aug - sqrt(lambda_ + n_aug_) * L.col(i);
  }

  /*****************************************************************************
  *  Predict Sigma Points
  ****************************************************************************/
  //predict sigma points
  for (int i = 0; i < 2 * n_aug_ + 1; i++)
  {
    //extract values for better readability
    double p_x      = Xsig_aug(0, i);
    double p_y      = Xsig_aug(1, i);
    double v        = Xsig_aug(2, i);
    double yaw      = Xsig_aug(3, i);
    double yawd     = Xsig_aug(4, i);
    double nu_a     = Xsig_aug(5, i);
    double nu_yawdd = Xsig_aug(6, i);

    //predicted state values
    double px_p, py_p;

    //avoid division by zero
    if (fabs(yawd) > 0.001) {
      px_p = p_x + v / yawd * (sin(yaw + yawd * delta_t) - sin(yaw));
      py_p = p_y + v / yawd * (cos(yaw) - cos(yaw + yawd * delta_t));
    }
    else {
      px_p = p_x + v * delta_t * cos(yaw);
      py_p = p_y + v * delta_t * sin(yaw);
    }

    double v_p = v;
    double yaw_p = yaw + yawd * delta_t;
    double yawd_p = yawd;

    //add noise
    px_p = px_p + 0.5 * nu_a * delta_t * delta_t * cos(yaw);
    py_p = py_p + 0.5 * nu_a * delta_t * delta_t * sin(yaw);
    v_p = v_p + nu_a*delta_t;

    yaw_p = yaw_p + 0.5*nu_yawdd*delta_t*delta_t;
    yawd_p = yawd_p + nu_yawdd*delta_t;

    //write predicted sigma point into right column
    Xsig_pred_(0, i) = px_p;
    Xsig_pred_(1, i) = py_p;
    Xsig_pred_(2, i) = v_p;
    Xsig_pred_(3, i) = yaw_p;
    Xsig_pred_(4, i) = yawd_p;
  }

  /*****************************************************************************
  *  Convert Predicted Sigma Points to Mean/Covariance
  ****************************************************************************/

  // set weights
  double weight_0 = lambda_ / (lambda_ + n_aug_);
  weights_(0) = weight_0;
  for (int i = 1; i < 2 * n_aug_ + 1; i++) {  //2n+1 weights
    double weight = 0.5 / (n_aug_ + lambda_);
    weights_(i) = weight;
  }

  //predicted state mean
  x_.fill(0.0);             //******* necessary? *********
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points
    x_ = x_ + weights_(i) * Xsig_pred_.col(i);
  }

  //predicted state covariance matrix
  P_.fill(0.0);             //******* necessary? *********
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points

    // state difference
    VectorXd x_diff = Xsig_pred_.col(i) - x_;
    //angle normalization
    while (x_diff(3)> M_PI) x_diff(3) -= 2.*M_PI;
    while (x_diff(3)<-M_PI) x_diff(3) += 2.*M_PI;

    P_ = P_ + weights_(i) * x_diff * x_diff.transpose();
  }

}